

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall
QtMWidgets::MessageBox::addButton(MessageBox *this,QAbstractButton *button,ButtonRole role)

{
  QWidget *pQVar1;
  parameter_type pQVar2;
  bool bVar3;
  MessageBoxPrivate *pMVar4;
  QFrame *pQVar5;
  QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
  *this_00;
  Object local_58 [8];
  QFlags<Qt::AlignmentFlag> local_50;
  QFlags<Qt::AlignmentFlag> local_4c;
  iterator local_48;
  QFlags<Qt::WindowType> local_2c;
  QFrame *local_28;
  QFrame *line;
  QAbstractButton *pQStack_18;
  ButtonRole role_local;
  QAbstractButton *button_local;
  MessageBox *this_local;
  
  line._4_4_ = role;
  pQStack_18 = button;
  button_local = (QAbstractButton *)this;
  pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(&this->d);
  bVar3 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::contains
                    (&pMVar4->buttonsMap,&stack0xffffffffffffffe8);
  if (!bVar3) {
    pQVar5 = (QFrame *)operator_new(0x28);
    pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(&this->d);
    pQVar1 = (QWidget *)pMVar4->frame;
    QFlags<Qt::WindowType>::QFlags(&local_2c);
    QFrame::QFrame(pQVar5,pQVar1,(QFlags_conflict1 *)(ulong)local_2c.i);
    local_28 = pQVar5;
    QFrame::setFrameStyle((int)pQVar5);
    this_00 = &this->d;
    pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(this_00);
    QList<QFrame_*>::append(&pMVar4->buttonSeparators,local_28);
    pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(this_00);
    local_48._M_node =
         (_Base_ptr)
         QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::insert
                   (&pMVar4->buttonsMap,&stack0xffffffffffffffe8,(ButtonRole *)((long)&line + 4));
    pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(this_00);
    QList<QAbstractButton_*>::append(&pMVar4->buttons,pQStack_18);
    pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(this_00);
    pQVar5 = local_28;
    pQVar1 = (QWidget *)pMVar4->hbox;
    QFlags<Qt::AlignmentFlag>::QFlags(&local_4c);
    QBoxLayout::addWidget(pQVar1,(int)pQVar5,(QFlags_conflict1 *)0x0);
    pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(this_00);
    pQVar2 = pQStack_18;
    pQVar1 = (QWidget *)pMVar4->hbox;
    QFlags<Qt::AlignmentFlag>::QFlags(&local_50);
    QBoxLayout::addWidget(pQVar1,(int)pQVar2,(QFlags_conflict1 *)0x0);
    QObject::connect<void(QAbstractButton::*)(bool),void(QtMWidgets::MessageBox::*)()>
              (local_58,(offset_in_QAbstractButton_to_subr)pQStack_18,
               (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(&this->d);
    (**(code **)(*(long *)pMVar4->vbox + 0xf0))();
    QWidget::resize((QSize *)this);
    pMVar4 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(&this->d);
    MessageBoxPrivate::adjustSize(pMVar4);
  }
  return;
}

Assistant:

void
MessageBox::addButton( QAbstractButton * button, ButtonRole role )
{
	if( !d->buttonsMap.contains( button ) )
	{
		QFrame * line = new QFrame( d->frame );
		line->setFrameStyle( QFrame::VLine | QFrame::Sunken );

		d->buttonSeparators.append( line );
		d->buttonsMap.insert( button, role );
		d->buttons.append( button );

		d->hbox->addWidget( line );
		d->hbox->addWidget( button );

		connect( button, &QAbstractButton::clicked,
			this, &MessageBox::_q_clicked );

		resize( d->vbox->sizeHint() );

		d->adjustSize();
	}
}